

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O2

bool tcu::isGatherCompareResultValid
               (TextureCubeView *texture,Sampler *sampler,TexComparePrecision *prec,Vec3 *coord,
               float cmpReference,Vec4 *result)

{
  CubeFace CVar1;
  int dim;
  ConstPixelBufferAccess *pCVar2;
  TextureFormat TVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Sampler *pSVar6;
  undefined4 coord_00;
  undefined4 coord_01;
  bool bVar7;
  bool bVar8;
  CmpResultSet resultSet;
  int iVar9;
  ConstPixelBufferAccess **ppCVar10;
  int i;
  int iVar11;
  long lVar12;
  int j;
  int iVar13;
  int offNdx;
  ulong uVar14;
  Vec3 *coord_02;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  CubeFaceIntCoords CVar19;
  int numPossibleFaces;
  Vec2 uBounds;
  Vec2 vBounds;
  CubeFace possibleFaces [6];
  ConstPixelBufferAccess faces [6];
  int local_194;
  float local_190;
  float local_18c;
  Sampler *local_188;
  float local_17c;
  float local_178;
  CubeFaceIntCoords local_174;
  ConstPixelBufferAccess **local_168;
  Vec3 *local_160;
  long local_158;
  Vec4 *local_150;
  CubeFace local_148 [8];
  undefined1 local_128 [16];
  undefined8 auStack_118 [29];
  
  local_194 = 0;
  local_188 = sampler;
  local_150 = result;
  TexVerifierUtil::getPossibleCubeFaces(coord,&prec->coordBits,local_148,&local_194);
  if (local_194 == 0) {
LAB_008f7be7:
    bVar7 = true;
  }
  else {
    local_168 = texture->m_levels;
    local_158 = 0;
    local_160 = coord;
    while( true ) {
      ppCVar10 = local_168;
      if (local_194 <= local_158) break;
      CVar1 = local_148[local_158];
      coord_02 = (Vec3 *)(ulong)CVar1;
      projectToFace((CubeFace)local_128,coord_02);
      coord_01 = local_128._4_4_;
      coord_00 = local_128._0_4_;
      bVar7 = isFixedPointDepthTextureFormat(&ppCVar10[(long)coord_02]->m_format);
      pSVar6 = local_188;
      dim = (ppCVar10[(long)coord_02]->m_size).m_data[0];
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_190,local_188->normalizedCoords,dim,(float)coord_00,
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_17c,pSVar6->normalizedCoords,dim,(float)coord_01,
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      fVar15 = local_190 + -0.5;
      fVar16 = local_18c + -0.5;
      fVar17 = local_17c + -0.5;
      fVar18 = local_178 + -0.5;
      lVar12 = 0;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)(local_128 + lVar12));
        lVar12 = lVar12 + 0x28;
      } while (lVar12 != 0xf0);
      fVar15 = floorf(fVar15);
      fVar17 = floorf(fVar17);
      for (lVar12 = 0; lVar12 != 0x1e; lVar12 = lVar12 + 5) {
        pCVar2 = *ppCVar10;
        *(void **)(local_128 + lVar12 * 8 + 0x20) = pCVar2->m_data;
        TVar3 = pCVar2->m_format;
        uVar4 = *(undefined8 *)(pCVar2->m_size).m_data;
        uVar5 = *(undefined8 *)((pCVar2->m_pitch).m_data + 1);
        *(undefined8 *)(local_128 + lVar12 * 8 + 0x10) =
             *(undefined8 *)((pCVar2->m_size).m_data + 2);
        *(undefined8 *)(local_128 + lVar12 * 8 + 0x18) = uVar5;
        *(TextureFormat *)(local_128 + (lVar12 * 2 + -2) * 4 + 8) = TVar3;
        *(undefined8 *)(local_128 + lVar12 * 8 + 8) = uVar4;
        ppCVar10 = ppCVar10 + 1;
      }
      fVar16 = floorf(fVar16);
      fVar18 = floorf(fVar18);
      for (iVar13 = (int)fVar17; iVar11 = (int)fVar15, iVar13 <= (int)fVar18; iVar13 = iVar13 + 1) {
        while (iVar11 <= (int)fVar16) {
          if ((isGatherCompareResultValid(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::TexComparePrecision_const&,tcu::CubeFaceCoords<float>const&,float,tcu::Vector<float,int>const&)
               ::offsets == '\0') &&
             (iVar9 = __cxa_guard_acquire(&isGatherCompareResultValid(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::TexComparePrecision_const&,tcu::CubeFaceCoords<float>const&,float,tcu::Vector<float,int>const&)
                                           ::offsets), iVar9 != 0)) {
            _offsets = 0x100000000;
            _DAT_00c238b8 = 0x100000001;
            _DAT_00c238c0 = 1;
            uRam0000000000c238c8 = 0;
            __cxa_guard_release(&isGatherCompareResultValid(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::TexComparePrecision_const&,tcu::CubeFaceCoords<float>const&,float,tcu::Vector<float,int>const&)
                                 ::offsets);
          }
          bVar8 = true;
          uVar14 = 0;
          while ((uVar14 < 4 && (bVar8 != false))) {
            local_174.s = (&isGatherCompareResultValid(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::TexComparePrecision_const&,tcu::CubeFaceCoords<float>const&,float,tcu::Vector<float,int>const&)
                            ::offsets)[uVar14 * 2] + iVar11;
            local_174.t = (&DAT_00c238b4)[uVar14 * 2] + iVar13;
            local_174.face = CVar1;
            CVar19 = remapCubeEdgeCoords(&local_174,dim);
            if ((ulong)CVar19.face == 6) goto LAB_008f7be7;
            fVar17 = ConstPixelBufferAccess::getPixDepth
                               ((ConstPixelBufferAccess *)(local_128 + (ulong)CVar19.face * 0x28),
                                CVar19.s,CVar19.t,0);
            resultSet = execCompare(local_188->compare,fVar17,cmpReference,prec->referenceBits,bVar7
                                   );
            bVar8 = isResultInSet(resultSet,local_150->m_data[uVar14],prec->resultBits);
            uVar14 = uVar14 + 1;
          }
          iVar11 = iVar11 + 1;
          if (bVar8 != false) goto LAB_008f7be7;
        }
      }
      local_158 = local_158 + 1;
    }
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool isGatherCompareResultValid (const TextureCubeView&			texture,
								 const Sampler&					sampler,
								 const TexComparePrecision&		prec,
								 const Vec3&					coord,
								 float							cmpReference,
								 const Vec4&					result)
{
	int			numPossibleFaces				= 0;
	CubeFace	possibleFaces[CUBEFACE_LAST];

	DE_ASSERT(isSamplerSupported(sampler));

	getPossibleCubeFaces(coord, prec.coordBits, &possibleFaces[0], numPossibleFaces);

	if (numPossibleFaces == 0)
		return true; // Result is undefined.

	for (int tryFaceNdx = 0; tryFaceNdx < numPossibleFaces; tryFaceNdx++)
	{
		const CubeFaceFloatCoords faceCoords(possibleFaces[tryFaceNdx], projectToFace(possibleFaces[tryFaceNdx], coord));

		if (isGatherCompareResultValid(texture, sampler, prec, faceCoords, cmpReference, result))
			return true;
	}

	return false;
}